

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dirread.c
# Opt level: O1

TIFFReadDirEntryErr TIFFReadDirEntrySshortArray(TIFF *tif,TIFFDirEntry *direntry,int16_t **value)

{
  uint16_t uVar1;
  ulong uVar2;
  ushort uVar3;
  uint uVar4;
  uint64_t uVar5;
  TIFFReadDirEntryErr TVar6;
  uint64_t *puVar7;
  short sVar8;
  long lVar9;
  TIFFReadDirEntryErr TVar10;
  uint64_t *puVar11;
  bool bVar12;
  uint32_t count;
  void *origdata;
  uint local_4c;
  uint64_t *local_48;
  int16_t **local_40;
  uint64_t *local_38;
  
  if (0x11 < direntry->tdir_type) {
    return TIFFReadDirEntryErrType;
  }
  if ((0x3035aU >> (direntry->tdir_type & 0x1f) & 1) == 0) {
    return TIFFReadDirEntryErrType;
  }
  TVar6 = TIFFReadDirEntryArrayWithLimit(tif,direntry,&local_4c,2,&local_38,0xffffffffffffffff);
  if (local_38 == (uint64_t *)0x0 || TVar6 != TIFFReadDirEntryErrOk) {
    *value = (int16_t *)0x0;
    return TVar6;
  }
  if (direntry->tdir_type == 8) {
    *value = (int16_t *)local_38;
    if ((tif->tif_flags & 0x80) != 0) {
      TIFFSwabArrayOfShort((uint16_t *)local_38,(ulong)local_4c);
      return TIFFReadDirEntryErrOk;
    }
    return TIFFReadDirEntryErrOk;
  }
  uVar4 = local_4c;
  puVar7 = local_38;
  if (direntry->tdir_type == 3) {
    while( true ) {
      if (uVar4 == 0) {
        *value = (int16_t *)local_38;
        return TIFFReadDirEntryErrOk;
      }
      if ((tif->tif_flags & 0x80) != 0) {
        TIFFSwabShort((uint16_t *)puVar7);
      }
      uVar3 = (ushort)*puVar7 >> 0xd;
      TVar6 = uVar3 & TIFFReadDirEntryErrRange;
      if ((uVar3 & 4) != 0) break;
      uVar4 = uVar4 - 1;
      puVar7 = (uint64_t *)((long)puVar7 + 2);
    }
    goto LAB_0029a7fb;
  }
  local_40 = value;
  puVar7 = (uint64_t *)_TIFFmallocExt(tif,(ulong)(local_4c * 2));
  if (puVar7 == (uint64_t *)0x0) {
    _TIFFfreeExt(tif,local_38);
    return TIFFReadDirEntryErrAlloc;
  }
  uVar1 = direntry->tdir_type;
  TVar6 = TIFFReadDirEntryErrOk;
  TVar10 = TIFFReadDirEntryErrOk;
  bVar12 = true;
  local_48 = puVar7;
  switch(uVar1) {
  case 1:
    TVar6 = TVar10;
    if (local_4c != 0) {
      TVar6 = TIFFReadDirEntryErrOk;
      lVar9 = 0;
      do {
        *(ushort *)((long)puVar7 + lVar9 * 2) = (ushort)*(byte *)((long)local_38 + lVar9);
        lVar9 = lVar9 + 1;
      } while (local_4c != (uint)lVar9);
    }
    break;
  case 2:
  case 3:
  case 5:
  case 7:
  case 8:
    break;
  case 4:
    TVar6 = TVar10;
    if (local_4c != 0) {
      lVar9 = 0;
      puVar11 = local_38;
      do {
        if ((tif->tif_flags & 0x80) != 0) {
          TIFFSwabLong((uint32_t *)puVar11);
          puVar7 = local_48;
        }
        uVar5 = *puVar11;
        bVar12 = (uint)uVar5 < 0x8000;
        if (!bVar12) goto LAB_0029a7cb;
        puVar11 = (uint64_t *)((long)puVar11 + 4);
        *(int16_t *)((long)puVar7 + lVar9 * 2) = (int16_t)(uint)uVar5;
        lVar9 = lVar9 + 1;
      } while (local_4c != (uint)lVar9);
LAB_0029a7c6:
      TVar6 = TIFFReadDirEntryErrOk;
    }
    break;
  case 6:
    TVar6 = TVar10;
    if (local_4c != 0) {
      TVar6 = TIFFReadDirEntryErrOk;
      lVar9 = 0;
      do {
        *(short *)((long)puVar7 + lVar9 * 2) = (short)*(char *)((long)local_38 + lVar9);
        lVar9 = lVar9 + 1;
      } while (local_4c != (uint)lVar9);
    }
    break;
  case 9:
    TVar6 = TVar10;
    if (local_4c != 0) {
      lVar9 = 0;
      puVar11 = local_38;
      do {
        if ((tif->tif_flags & 0x80) != 0) {
          TIFFSwabLong((uint32_t *)puVar11);
          puVar7 = local_48;
        }
        sVar8 = (short)(int)*puVar11;
        bVar12 = (int)sVar8 == (int)*puVar11;
        if (!bVar12) goto LAB_0029a7cb;
        puVar11 = (uint64_t *)((long)puVar11 + 4);
        *(short *)((long)puVar7 + lVar9 * 2) = sVar8;
        lVar9 = lVar9 + 1;
      } while (local_4c != (uint)lVar9);
      goto LAB_0029a7c6;
    }
    break;
  default:
    if (uVar1 == 0x10) {
      TVar6 = TVar10;
      if (local_4c != 0) {
        lVar9 = 0;
        puVar11 = local_38;
        do {
          if ((tif->tif_flags & 0x80) != 0) {
            TIFFSwabLong8(puVar11);
            puVar7 = local_48;
          }
          uVar2 = *puVar11;
          bVar12 = uVar2 < 0x8000;
          if (!bVar12) goto LAB_0029a7cb;
          puVar11 = puVar11 + 1;
          *(int16_t *)((long)puVar7 + lVar9 * 2) = (int16_t)uVar2;
          lVar9 = lVar9 + 1;
        } while (local_4c != (uint)lVar9);
        goto LAB_0029a7c6;
      }
    }
    else if ((uVar1 == 0x11) && (local_4c != 0)) {
      lVar9 = 0;
      puVar11 = local_38;
      do {
        if ((tif->tif_flags & 0x80) != 0) {
          TIFFSwabLong8(puVar11);
          puVar7 = local_48;
        }
        sVar8 = (short)*puVar11;
        bVar12 = (long)sVar8 == *puVar11;
        if (!bVar12) goto LAB_0029a7cb;
        puVar11 = puVar11 + 1;
        *(short *)((long)puVar7 + lVar9 * 2) = sVar8;
        lVar9 = lVar9 + 1;
      } while (local_4c != (uint)lVar9);
      goto LAB_0029a7c6;
    }
  }
switchD_0029a633_caseD_2:
  _TIFFfreeExt(tif,local_38);
  local_38 = local_48;
  if (bVar12) {
    *local_40 = (int16_t *)local_48;
    return TIFFReadDirEntryErrOk;
  }
LAB_0029a7fb:
  _TIFFfreeExt(tif,local_38);
  return TVar6;
LAB_0029a7cb:
  TVar6 = TIFFReadDirEntryErrRange;
  goto switchD_0029a633_caseD_2;
}

Assistant:

static enum TIFFReadDirEntryErr
TIFFReadDirEntrySshortArray(TIFF *tif, TIFFDirEntry *direntry, int16_t **value)
{
    enum TIFFReadDirEntryErr err;
    uint32_t count;
    void *origdata;
    int16_t *data;
    switch (direntry->tdir_type)
    {
        case TIFF_BYTE:
        case TIFF_SBYTE:
        case TIFF_SHORT:
        case TIFF_SSHORT:
        case TIFF_LONG:
        case TIFF_SLONG:
        case TIFF_LONG8:
        case TIFF_SLONG8:
            break;
        default:
            return (TIFFReadDirEntryErrType);
    }
    err = TIFFReadDirEntryArray(tif, direntry, &count, 2, &origdata);
    if ((err != TIFFReadDirEntryErrOk) || (origdata == 0))
    {
        *value = 0;
        return (err);
    }
    switch (direntry->tdir_type)
    {
        case TIFF_SHORT:
        {
            uint16_t *m;
            uint32_t n;
            m = (uint16_t *)origdata;
            for (n = 0; n < count; n++)
            {
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabShort(m);
                err = TIFFReadDirEntryCheckRangeSshortShort(*m);
                if (err != TIFFReadDirEntryErrOk)
                {
                    _TIFFfreeExt(tif, origdata);
                    return (err);
                }
                m++;
            }
            *value = (int16_t *)origdata;
            return (TIFFReadDirEntryErrOk);
        }
        case TIFF_SSHORT:
            *value = (int16_t *)origdata;
            if (tif->tif_flags & TIFF_SWAB)
                TIFFSwabArrayOfShort((uint16_t *)(*value), count);
            return (TIFFReadDirEntryErrOk);
    }
    data = (int16_t *)_TIFFmallocExt(tif, count * 2);
    if (data == 0)
    {
        _TIFFfreeExt(tif, origdata);
        return (TIFFReadDirEntryErrAlloc);
    }
    switch (direntry->tdir_type)
    {
        case TIFF_BYTE:
        {
            uint8_t *ma;
            int16_t *mb;
            uint32_t n;
            ma = (uint8_t *)origdata;
            mb = data;
            for (n = 0; n < count; n++)
                *mb++ = (int16_t)(*ma++);
        }
        break;
        case TIFF_SBYTE:
        {
            int8_t *ma;
            int16_t *mb;
            uint32_t n;
            ma = (int8_t *)origdata;
            mb = data;
            for (n = 0; n < count; n++)
                *mb++ = (int16_t)(*ma++);
        }
        break;
        case TIFF_LONG:
        {
            uint32_t *ma;
            int16_t *mb;
            uint32_t n;
            ma = (uint32_t *)origdata;
            mb = data;
            for (n = 0; n < count; n++)
            {
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabLong(ma);
                err = TIFFReadDirEntryCheckRangeSshortLong(*ma);
                if (err != TIFFReadDirEntryErrOk)
                    break;
                *mb++ = (int16_t)(*ma++);
            }
        }
        break;
        case TIFF_SLONG:
        {
            int32_t *ma;
            int16_t *mb;
            uint32_t n;
            ma = (int32_t *)origdata;
            mb = data;
            for (n = 0; n < count; n++)
            {
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabLong((uint32_t *)ma);
                err = TIFFReadDirEntryCheckRangeSshortSlong(*ma);
                if (err != TIFFReadDirEntryErrOk)
                    break;
                *mb++ = (int16_t)(*ma++);
            }
        }
        break;
        case TIFF_LONG8:
        {
            uint64_t *ma;
            int16_t *mb;
            uint32_t n;
            ma = (uint64_t *)origdata;
            mb = data;
            for (n = 0; n < count; n++)
            {
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabLong8(ma);
                err = TIFFReadDirEntryCheckRangeSshortLong8(*ma);
                if (err != TIFFReadDirEntryErrOk)
                    break;
                *mb++ = (int16_t)(*ma++);
            }
        }
        break;
        case TIFF_SLONG8:
        {
            int64_t *ma;
            int16_t *mb;
            uint32_t n;
            ma = (int64_t *)origdata;
            mb = data;
            for (n = 0; n < count; n++)
            {
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabLong8((uint64_t *)ma);
                err = TIFFReadDirEntryCheckRangeSshortSlong8(*ma);
                if (err != TIFFReadDirEntryErrOk)
                    break;
                *mb++ = (int16_t)(*ma++);
            }
        }
        break;
    }
    _TIFFfreeExt(tif, origdata);
    if (err != TIFFReadDirEntryErrOk)
    {
        _TIFFfreeExt(tif, data);
        return (err);
    }
    *value = data;
    return (TIFFReadDirEntryErrOk);
}